

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pic.c
# Opt level: O2

void sysbvm_pic_addSelectorTypeAndMethod
               (sysbvm_pic_t *pic,sysbvm_tuple_t selector,sysbvm_tuple_t type,sysbvm_tuple_t method)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = sysbvm_pic_writeLock(pic);
  uVar2 = uVar1 & 3;
  pic->entries[uVar2].type = type;
  pic->entries[uVar2].selector = selector;
  pic->entries[uVar2].method = method;
  pic->postSequence = uVar1;
  return;
}

Assistant:

SYSBVM_API void sysbvm_pic_addSelectorTypeAndMethod(sysbvm_pic_t *pic, sysbvm_tuple_t selector, sysbvm_tuple_t type, sysbvm_tuple_t method)
{
    unsigned int sequence = sysbvm_pic_writeLock(pic);
    unsigned int entryIndex = sequence % SYSBVM_PIC_ENTRY_COUNT;
    sysbvm_picEntry_t *entry = pic->entries + entryIndex;
    entry->type = type;
    entry->selector = selector;
    entry->method = method;

    sysbvm_pic_writeUnlock(pic, sequence);
}